

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int binCollFunc(void *padFlag,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int local_3c;
  int local_34;
  int n;
  int rc;
  void *pKey2_local;
  int nKey2_local;
  void *pKey1_local;
  int nKey1_local;
  void *padFlag_local;
  
  local_3c = nKey2;
  if (nKey1 < nKey2) {
    local_3c = nKey1;
  }
  local_34 = memcmp(pKey1,pKey2,(long)local_3c);
  if ((local_34 == 0) &&
     (((padFlag == (void *)0x0 ||
       (iVar1 = allSpaces((char *)((long)pKey1 + (long)local_3c),nKey1 - local_3c), iVar1 == 0)) ||
      (iVar1 = allSpaces((char *)((long)pKey2 + (long)local_3c),nKey2 - local_3c), iVar1 == 0)))) {
    local_34 = nKey1 - nKey2;
  }
  return local_34;
}

Assistant:

static int binCollFunc(
  void *padFlag,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int rc, n;
  n = nKey1<nKey2 ? nKey1 : nKey2;
  rc = memcmp(pKey1, pKey2, n);
  if( rc==0 ){
    if( padFlag
     && allSpaces(((char*)pKey1)+n, nKey1-n)
     && allSpaces(((char*)pKey2)+n, nKey2-n)
    ){
      /* Leave rc unchanged at 0 */
    }else{
      rc = nKey1 - nKey2;
    }
  }
  return rc;
}